

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.cpp
# Opt level: O0

optional<(anonymous_namespace)::ParseFunctionResult> *
anon_unknown.dwarf_c5c2e::parseFunction
          (const_iterator *iBegin,const_iterator *iEnd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *functionNames,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argNames,size_t argCount)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var3;
  const_iterator iBegin_00;
  reference pcVar4;
  ParseFunctionResult *pPVar5;
  ParsedWord *pPVar6;
  ulong uVar7;
  size_type sVar8;
  char *__s;
  undefined8 uVar9;
  undefined8 in_RCX;
  Exception *in_RDX;
  undefined8 in_RSI;
  optional<(anonymous_namespace)::ParseFunctionResult> *in_RDI;
  ulong in_R9;
  optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oVar10;
  optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> r_1;
  const_iterator i;
  const_iterator next;
  optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  r;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  anon_union_2_2_77b2ba79 flags;
  string currentArgName;
  optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  func;
  optional<(anonymous_namespace)::ParseFunctionResult> result;
  ParseFunctionResult *in_stack_fffffffffffffbf8;
  ParseFunctionResult *in_stack_fffffffffffffc00;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffc08;
  vector<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  *in_stack_fffffffffffffc20;
  allocator<char> *in_stack_fffffffffffffc30;
  key_type *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc48;
  const_iterator *itEnd;
  vector<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  Code CVar11;
  Exception *in_stack_fffffffffffffc60;
  const_iterator in_stack_fffffffffffffca8;
  const_reference in_stack_fffffffffffffcb0;
  const_iterator *in_stack_fffffffffffffd28;
  const_iterator *in_stack_fffffffffffffd30;
  const_iterator *in_stack_fffffffffffffd38;
  const_iterator local_2b9 [4];
  undefined1 local_292;
  char *local_240;
  undefined1 local_232;
  _Self local_210;
  _Self local_208;
  string local_200 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0 [12];
  char *local_180;
  char *local_178;
  char *local_170;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  ushort local_15a;
  string local_158 [32];
  int local_138;
  undefined8 local_128;
  undefined8 local_120;
  Exception *local_118;
  undefined1 *local_110;
  _Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_108;
  undefined1 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [104];
  ulong local_30;
  undefined8 local_20;
  Exception *local_18;
  undefined8 local_10;
  
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ParseFunctionResult::ParseFunctionResult(in_stack_fffffffffffffc00);
  std::optional<(anonymous_namespace)::ParseFunctionResult>::
  optional<(anonymous_namespace)::ParseFunctionResult,_true>
            ((optional<(anonymous_namespace)::ParseFunctionResult> *)in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbf8);
  ParseFunctionResult::~ParseFunctionResult(in_stack_fffffffffffffc00);
  local_128 = local_20;
  local_120 = local_10;
  local_118 = local_18;
  local_110 = local_98;
  oVar10 = (anonymous_namespace)::
           parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
           ::$_0::operator()[abi_cxx11_((anon_class_32_4_c9b8674a *)in_stack_fffffffffffffc60);
  local_108 = oVar10.
              super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_payload;
  local_100 = oVar10.
              super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1613c5);
  if (!bVar1) {
    std::optional<(anonymous_namespace)::ParseFunctionResult>::optional
              ((optional<(anonymous_namespace)::ParseFunctionResult> *)0x1613d6);
    local_138 = 1;
LAB_00161f33:
    std::optional<(anonymous_namespace)::ParseFunctionResult>::~optional
              ((optional<(anonymous_namespace)::ParseFunctionResult> *)0x161f40);
    return in_RDI;
  }
  std::__cxx11::string::string(local_158);
  (anonymous_namespace)::
  parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
  ::$_1::__1((__1 *)&local_15a);
  local_15a = local_15a & 0xfff2 | 0xd;
  p_Var3 = std::
           optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*((optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x16145c);
  local_168._M_current = p_Var3->_M_current;
LAB_00161467:
  do {
    iBegin_00 = parseComment(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    local_170 = iBegin_00._M_current;
    local_168._M_current = iBegin_00._M_current;
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffc00,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffbf8);
    CVar11 = (Code)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    if (bVar1) {
LAB_00161e30:
      uVar9 = __cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
                 in_stack_fffffffffffffc30);
      rlib::sequencer::MmlCompiler::Exception::Exception
                (in_stack_fffffffffffffc60,CVar11,(const_iterator *)in_stack_fffffffffffffc50,
                 (const_iterator *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      __cxa_throw(uVar9,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                  rlib::sequencer::MmlCompiler::Exception::~Exception);
    }
    if (((local_15a & 1) != 0) &&
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_168), *pcVar4 == ')')) {
      local_178 = (char *)__gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffffc08,
                                      (difference_type)in_stack_fffffffffffffc00);
      pPVar5 = std::optional<(anonymous_namespace)::ParseFunctionResult>::operator->
                         ((optional<(anonymous_namespace)::ParseFunctionResult> *)0x16152f);
      (pPVar5->next)._M_current = local_178;
      std::optional<(anonymous_namespace)::ParseFunctionResult>::optional
                ((optional<(anonymous_namespace)::ParseFunctionResult> *)in_stack_fffffffffffffc00,
                 (optional<(anonymous_namespace)::ParseFunctionResult> *)in_stack_fffffffffffffbf8);
      local_138 = 1;
      std::__cxx11::string::~string(local_158);
      goto LAB_00161f33;
    }
    if ((((byte)local_15a._0_1_ >> 1 & 1) == 0) ||
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_168), *pcVar4 != ',')) {
      if (((byte)local_15a._0_1_ >> 2 & 1) != 0) {
        if (((anonymous_namespace)::
             parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
             ::re == '\0') &&
           (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                         parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
                                         ::re), iVar2 != 0)) {
          boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
          basic_regex(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                      (flag_type_conflict)((ulong)in_stack_fffffffffffffc10 >> 0x20));
          __cxa_atexit(boost::
                       basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                       ::~basic_regex,&parseFunction::re,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               parseFunction(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,unsigned_long)
                               ::re);
        }
        regexSearch((const_iterator *)iBegin_00._M_current,
                    (const_iterator *)in_stack_fffffffffffffcb0,
                    (regex *)in_stack_fffffffffffffca8._M_current);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)0x161695);
        if (bVar1) {
          std::
          optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::operator*((optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)0x1616ab);
          in_stack_fffffffffffffcb0 =
               boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](in_stack_fffffffffffffc08,
                            (int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
          in_stack_fffffffffffffca8 =
               parseComment(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          local_1e0[0]._M_current = in_stack_fffffffffffffca8._M_current;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(local_1e0);
          if (*pcVar4 != ':') goto LAB_00161971;
          std::
          optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::operator*((optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)0x161718);
          boost::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[](in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
          boost::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(in_stack_fffffffffffffc48);
          std::__cxx11::string::operator=(local_158,local_200);
          std::__cxx11::string::~string(local_200);
          local_208._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffbf8,(key_type *)0x16178a);
          local_210._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffbf8);
          bVar1 = std::operator==(&local_208,&local_210);
          CVar11 = (Code)((ulong)in_stack_fffffffffffffc58 >> 0x20);
          if (bVar1) {
            local_232 = 1;
            uVar9 = __cxa_allocate_exception(0x60);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
                       in_stack_fffffffffffffc30);
            rlib::sequencer::MmlCompiler::Exception::Exception
                      (in_stack_fffffffffffffc60,CVar11,(const_iterator *)in_stack_fffffffffffffc50,
                       (const_iterator *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
            local_232 = 0;
            __cxa_throw(uVar9,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                        rlib::sequencer::MmlCompiler::Exception::~Exception);
          }
          local_240 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_fffffffffffffc08,
                                          (difference_type)in_stack_fffffffffffffc00);
          local_15a = 8;
          local_138 = 2;
          local_168 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_240;
        }
        else {
LAB_00161971:
          local_138 = 0;
        }
        std::
        optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~optional((optional<boost::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)0x161989);
        if (local_138 != 0) goto LAB_00161467;
      }
      CVar11 = (Code)((ulong)in_stack_fffffffffffffc58 >> 0x20);
      if (((byte)local_15a._0_1_ >> 3 & 1) == 0) goto LAB_00161e30;
      rlib::sequencer::MmlCompiler::Util::parseWord
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)0x1619f4);
      CVar11 = (Code)((ulong)in_stack_fffffffffffffc58 >> 0x20);
      if (!bVar1) {
        uVar9 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
                   in_stack_fffffffffffffc30);
        rlib::sequencer::MmlCompiler::Exception::Exception
                  (in_stack_fffffffffffffc60,CVar11,(const_iterator *)in_stack_fffffffffffffc50,
                   (const_iterator *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
        __cxa_throw(uVar9,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                    rlib::sequencer::MmlCompiler::Exception::~Exception);
      }
      std::optional<rlib::sequencer::MmlCompiler::Util::ParsedWord>::operator->
                ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)0x161a0a);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)0x161a12);
      if (!bVar1) {
        local_292 = 1;
        uVar9 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
                   in_stack_fffffffffffffc30);
        rlib::sequencer::MmlCompiler::Exception::Exception
                  (local_18,(Code)((ulong)uVar9 >> 0x20),(const_iterator *)in_stack_fffffffffffffc50
                   ,(const_iterator *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
        local_292 = 0;
        __cxa_throw(uVar9,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                    rlib::sequencer::MmlCompiler::Exception::~Exception);
      }
      pPVar6 = std::optional<rlib::sequencer::MmlCompiler::Util::ParsedWord>::operator->
                         ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)0x161b22);
      local_168._M_current = (pPVar6->next)._M_current;
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::optional<rlib::sequencer::MmlCompiler::Util::ParsedWord>::operator->
                  ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)0x161caf);
        std::
        optional<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator*((optional<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)0x161cb7);
        std::optional<(anonymous_namespace)::ParseFunctionResult>::operator->
                  ((optional<(anonymous_namespace)::ParseFunctionResult> *)0x161cc9);
        in_stack_fffffffffffffc30 =
             (allocator<char> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        std::
        variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=((variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffc00,
                    (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffbf8);
        std::__cxx11::string::clear();
      }
      else {
        pPVar5 = std::optional<(anonymous_namespace)::ParseFunctionResult>::operator->
                           ((optional<(anonymous_namespace)::ParseFunctionResult> *)0x161b51);
        in_stack_fffffffffffffc50 = &pPVar5->argsList;
        std::optional<rlib::sequencer::MmlCompiler::Util::ParsedWord>::operator->
                  ((optional<rlib::sequencer::MmlCompiler::Util::ParsedWord> *)0x161b67);
        std::
        optional<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator*((optional<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)0x161b6f);
        std::
        vector<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,std::allocator<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
        ::
        emplace_back<std::variant<long,unsigned_long,double,std::pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
                  (in_stack_fffffffffffffc10,
                   (variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffc08);
        pPVar5 = std::optional<(anonymous_namespace)::ParseFunctionResult>::operator->
                           ((optional<(anonymous_namespace)::ParseFunctionResult> *)0x161b8b);
        sVar8 = std::
                vector<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::variant<long,_unsigned_long,_double,_std::pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::size(&pPVar5->argsList);
        CVar11 = (Code)((ulong)in_stack_fffffffffffffc58 >> 0x20);
        if (local_30 < sVar8) {
          __s = (char *)__cxa_allocate_exception(0x60);
          itEnd = local_2b9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18,
                     __s,in_stack_fffffffffffffc30);
          rlib::sequencer::MmlCompiler::Exception::Exception
                    (in_stack_fffffffffffffc60,CVar11,(const_iterator *)in_stack_fffffffffffffc50,
                     itEnd,(string *)local_18);
          __cxa_throw(__s,&rlib::sequencer::MmlCompiler::Exception::typeinfo,
                      rlib::sequencer::MmlCompiler::Exception::~Exception);
        }
      }
      local_15a = 3;
      goto LAB_00161467;
    }
    local_180 = (char *)__gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffc08,
                                     (int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    local_15a = 0xd;
  } while( true );
}

Assistant:

auto parseFunction(
	const std::string::const_iterator& iBegin,
	const std::string::const_iterator& iEnd,
	const std::vector<std::string>& functionNames,				// 関数名
	const std::set<std::string>& argNames,						// 名前付き引数名(ココにない引数名はエラー)
	const size_t argCount = (std::numeric_limits<size_t>::max)()	// 名前ナシ引数数(ココを超える数の引数はエラー)
) {
	std::optional<ParseFunctionResult> result = ParseFunctionResult();

	const auto func = [&]()->std::optional<std::string::const_iterator> {
		struct R {
			PairIterator				functionName;	// 関数名
			std::string::const_iterator	next;			// 次の位置
		};
		for (auto& name : functionNames) {
			const auto r = isStartsWith(iBegin, iEnd, name);
			if (!r) continue;
			auto it = parseComment(*r, iEnd);		// コメントを読み飛ばす
			if (it == iEnd || *it != '(') continue;
			it++;
			result->functionName = { iBegin,*r };
			return it;
		}
		return std::nullopt;
	}();
	if (!func) return decltype(result)();		// 該当しなかった

	std::string currentArgName;
	union {									// 次トークン情報
		struct {
			uint16_t	rightParen : 1;		// )
			uint16_t	comma : 1;			// ,
			uint16_t	argName : 1;		// 引数名
			uint16_t	argValue : 1;		// 引数値
		};
		uint16_t		all = 0;
	}flags;
	flags.rightParen = true;
	flags.argName = true;
	flags.argValue = true;

	auto it = *func;
	while (true) {
		it = parseComment(it, iEnd);		// コメントを読み飛ばす
		if (it == iEnd) break;

		if (flags.rightParen && *it == ')') {		// )
			result->next = it + 1;						// 次の位置
			return result;								// 正常終了
		}

		if (flags.comma && *it == ',') {			// ,
			it++;
			flags.all = 0;
			flags.rightParen = true;
			flags.argName = true;
			flags.argValue = true;
			continue;
		}

		if (flags.argName) {		// 引数名
			static const auto re = regex(R"(^([a-zA-Z]\w*))");
			if (const auto r = regexSearch(it, iEnd, re)) {
				const auto next = parseComment((*r)[0].second, iEnd);			// コメントを読み飛ばす
				if (*next == ':') {													// ":" があれば引数名で確定
					currentArgName = (*r)[0].str();
					if (auto i = argNames.find(currentArgName); i == argNames.end()) {	// 引数名チェック
						throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentUnknownError, it, iEnd);
					}
					it = next + 1;
					flags.all = 0;
					flags.argValue = true;
					continue;
				}
			}
		}

		if (flags.argValue) {		// 引数値

			if (auto r = MmlCompiler::Util::parseWord(it, iEnd)) {
				if (!r->word) {			// パースエラー
					throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);	// 文字列パースエラーとする
				}
				it = r->next;
				if (currentArgName.empty()) {
					result->argsList.emplace_back(std::move(*r->word));
					if (result->argsList.size() > argCount) {
						throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);	// 引数が多すぎる
					}
				} else {
					result->argsName[currentArgName] = std::move(*r->word);
					currentArgName.clear();
				}
				flags.all = 0;
				flags.rightParen = true;
				flags.comma = true;
				continue;
			}

			throw MmlCompiler::Exception(MmlCompiler::Exception::Code::argumentError, it, iEnd);
		}

		break;		// どれにも該当しないならエラー
	}
	throw MmlCompiler::Exception(MmlCompiler::Exception::Code::functionCallError, it, iEnd);
}